

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Animatable<tinyusdz::DomeLight::TextureFormat>::get_scalar
          (Animatable<tinyusdz::DomeLight::TextureFormat> *this,TextureFormat *v)

{
  bool bVar1;
  TextureFormat *v_local;
  Animatable<tinyusdz::DomeLight::TextureFormat> *this_local;
  
  if (v == (TextureFormat *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = is_blocked(this);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = has_value(this);
      if (bVar1) {
        *v = this->_value;
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool get_scalar(T *v) const {
    if (!v) {
      return false;
    }

    if (is_blocked()) {
      return false;
    } else if (has_value()) {
      (*v) = _value;
      return true;
    }

    // timesamples
    return false;
  }